

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

void __thiscall
kratos::Generator::remove_child_generator(Generator *this,shared_ptr<kratos::Generator> *child)

{
  __node_base_ptr *this_00;
  bool bVar1;
  PortDirection PVar2;
  int iVar3;
  element_type *peVar4;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar5;
  element_type *peVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_01;
  element_type *this_02;
  Var **ppVVar7;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  shared_ptr<kratos::Stmt> local_1e0;
  shared_ptr<kratos::AssignStmt> *local_1d0;
  shared_ptr<kratos::AssignStmt> *stmt_1;
  iterator __end4_1;
  iterator __begin4_1;
  unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  *__range4_1;
  _Node_iterator_base<std::shared_ptr<kratos::AssignStmt>,_false> local_1a8;
  _Node_iterator_base<std::shared_ptr<kratos::AssignStmt>,_false> local_1a0;
  undefined1 local_198 [8];
  unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  sinks;
  Var *sink;
  shared_ptr<kratos::AssignStmt> *stmt;
  iterator __end4;
  iterator __begin4;
  unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  *__range4;
  _Node_iterator_base<std::shared_ptr<kratos::AssignStmt>,_false> local_120;
  _Node_iterator_base<std::shared_ptr<kratos::AssignStmt>,_false> local_118;
  undefined1 local_110 [8];
  unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  srcs;
  shared_ptr<kratos::Port> port;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *port_name;
  iterator __end2;
  iterator __begin2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  port_names;
  const_iterator local_70;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_68 [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_48;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_40;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  pos;
  string child_name;
  shared_ptr<kratos::Generator> *child_local;
  Generator *this_local;
  
  peVar4 = std::__shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)child);
  std::__cxx11::string::string((string *)&pos,(string *)&peVar4->instance_name);
  local_48._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(&this->children_names_);
  local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(&this->children_names_);
  local_40 = std::
             find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                       (local_48,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  )local_50,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pos);
  local_68[0]._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(&this->children_names_);
  bVar1 = __gnu_cxx::operator!=(&local_40,local_68);
  if (bVar1) {
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_70,&local_40);
    port_names._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::erase(&this->children_names_,local_70);
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Generator>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Generator>_>_>_>
    ::erase(&this->children_,(key_type *)&pos);
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::erase(&this->children_comments_,(key_type *)&pos);
    peVar4 = std::__shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)child);
    psVar5 = get_port_names_abi_cxx11_(peVar4);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&__range2,psVar5);
    __end2 = std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__range2);
    port_name = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&__range2);
    while (bVar1 = std::operator!=(&__end2,(_Self *)&port_name), bVar1) {
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator*(&__end2);
      peVar4 = std::__shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)child);
      get_port((Generator *)&srcs._M_h._M_single_bucket,(string *)peVar4);
      peVar6 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&srcs._M_h._M_single_bucket);
      PVar2 = Port::port_direction(peVar6);
      if (PVar2 == In) {
        peVar6 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&srcs._M_h._M_single_bucket);
        iVar3 = (*(peVar6->super_Var).super_IRNode._vptr_IRNode[0x10])();
        local_118._M_cur =
             (__node_type *)
             std::
             unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
             ::begin((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                      *)CONCAT44(extraout_var,iVar3));
        peVar6 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&srcs._M_h._M_single_bucket);
        iVar3 = (*(peVar6->super_Var).super_IRNode._vptr_IRNode[0x10])();
        local_120._M_cur =
             (__node_type *)
             std::
             unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
             ::end((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                    *)CONCAT44(extraout_var_00,iVar3));
        std::allocator<std::shared_ptr<kratos::AssignStmt>_>::allocator
                  ((allocator<std::shared_ptr<kratos::AssignStmt>_> *)((long)&__range4 + 5));
        std::
        unordered_set<std::shared_ptr<kratos::AssignStmt>,std::hash<std::shared_ptr<kratos::AssignStmt>>,std::equal_to<std::shared_ptr<kratos::AssignStmt>>,std::allocator<std::shared_ptr<kratos::AssignStmt>>>
        ::
        unordered_set<std::__detail::_Node_const_iterator<std::shared_ptr<kratos::AssignStmt>,true,false>>
                  ((unordered_set<std::shared_ptr<kratos::AssignStmt>,std::hash<std::shared_ptr<kratos::AssignStmt>>,std::equal_to<std::shared_ptr<kratos::AssignStmt>>,std::allocator<std::shared_ptr<kratos::AssignStmt>>>
                    *)local_110,
                   (_Node_const_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false>)
                   local_118._M_cur,
                   (_Node_const_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false>)
                   local_120._M_cur,0,(hasher *)((long)&__range4 + 7),
                   (key_equal *)((long)&__range4 + 6),
                   (allocator<std::shared_ptr<kratos::AssignStmt>_> *)((long)&__range4 + 5));
        std::allocator<std::shared_ptr<kratos::AssignStmt>_>::~allocator
                  ((allocator<std::shared_ptr<kratos::AssignStmt>_> *)((long)&__range4 + 5));
        __end4 = std::
                 unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                 ::begin((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                          *)local_110);
        stmt = (shared_ptr<kratos::AssignStmt> *)
               std::
               unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
               ::end((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                      *)local_110);
        while (bVar1 = std::__detail::operator!=
                                 (&__end4.
                                   super__Node_iterator_base<std::shared_ptr<kratos::AssignStmt>,_false>
                                  ,(_Node_iterator_base<std::shared_ptr<kratos::AssignStmt>,_false>
                                    *)&stmt), bVar1) {
          this_01 = (__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)std::__detail::
                       _Node_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false>::operator*
                                 (&__end4);
          this_02 = std::
                    __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->(this_01);
          ppVVar7 = AssignStmt::right(this_02);
          Var::unassign(*ppVVar7,(shared_ptr<kratos::AssignStmt> *)this_01);
          this_00 = &sinks._M_h._M_single_bucket;
          std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
                    ((shared_ptr<kratos::Stmt> *)this_00,(shared_ptr<kratos::AssignStmt> *)this_01);
          remove_stmt_from_parent((shared_ptr<kratos::Stmt> *)this_00);
          std::shared_ptr<kratos::Stmt>::~shared_ptr
                    ((shared_ptr<kratos::Stmt> *)&sinks._M_h._M_single_bucket);
          std::__detail::_Node_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false>::
          operator++(&__end4);
        }
        std::
        unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
        ::~unordered_set((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                          *)local_110);
      }
      else {
        peVar6 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&srcs._M_h._M_single_bucket);
        iVar3 = (*(peVar6->super_Var).super_IRNode._vptr_IRNode[0xe])();
        local_1a0._M_cur =
             (__node_type *)
             std::
             unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
             ::begin((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                      *)CONCAT44(extraout_var_01,iVar3));
        peVar6 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&srcs._M_h._M_single_bucket);
        iVar3 = (*(peVar6->super_Var).super_IRNode._vptr_IRNode[0xe])();
        local_1a8._M_cur =
             (__node_type *)
             std::
             unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
             ::end((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                    *)CONCAT44(extraout_var_02,iVar3));
        std::allocator<std::shared_ptr<kratos::AssignStmt>_>::allocator
                  ((allocator<std::shared_ptr<kratos::AssignStmt>_> *)((long)&__range4_1 + 5));
        std::
        unordered_set<std::shared_ptr<kratos::AssignStmt>,std::hash<std::shared_ptr<kratos::AssignStmt>>,std::equal_to<std::shared_ptr<kratos::AssignStmt>>,std::allocator<std::shared_ptr<kratos::AssignStmt>>>
        ::
        unordered_set<std::__detail::_Node_const_iterator<std::shared_ptr<kratos::AssignStmt>,true,false>>
                  ((unordered_set<std::shared_ptr<kratos::AssignStmt>,std::hash<std::shared_ptr<kratos::AssignStmt>>,std::equal_to<std::shared_ptr<kratos::AssignStmt>>,std::allocator<std::shared_ptr<kratos::AssignStmt>>>
                    *)local_198,
                   (_Node_const_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false>)
                   local_1a0._M_cur,
                   (_Node_const_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false>)
                   local_1a8._M_cur,0,(hasher *)((long)&__range4_1 + 7),
                   (key_equal *)((long)&__range4_1 + 6),
                   (allocator<std::shared_ptr<kratos::AssignStmt>_> *)((long)&__range4_1 + 5));
        std::allocator<std::shared_ptr<kratos::AssignStmt>_>::~allocator
                  ((allocator<std::shared_ptr<kratos::AssignStmt>_> *)((long)&__range4_1 + 5));
        __end4_1 = std::
                   unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                   ::begin((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                            *)local_198);
        stmt_1 = (shared_ptr<kratos::AssignStmt> *)
                 std::
                 unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                 ::end((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                        *)local_198);
        while (bVar1 = std::__detail::operator!=
                                 (&__end4_1.
                                   super__Node_iterator_base<std::shared_ptr<kratos::AssignStmt>,_false>
                                  ,(_Node_iterator_base<std::shared_ptr<kratos::AssignStmt>,_false>
                                    *)&stmt_1), bVar1) {
          local_1d0 = std::__detail::
                      _Node_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false>::operator*
                                (&__end4_1);
          peVar6 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&srcs._M_h._M_single_bucket);
          Var::unassign(&peVar6->super_Var,local_1d0);
          std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>(&local_1e0,local_1d0);
          remove_stmt_from_parent(&local_1e0);
          std::shared_ptr<kratos::Stmt>::~shared_ptr(&local_1e0);
          std::__detail::_Node_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false>::
          operator++(&__end4_1);
        }
        std::
        unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
        ::~unordered_set((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                          *)local_198);
      }
      std::shared_ptr<kratos::Port>::~shared_ptr
                ((shared_ptr<kratos::Port> *)&srcs._M_h._M_single_bucket);
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end2);
    }
    peVar4 = std::__shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)child);
    peVar4->parent_generator_ = (Generator *)0x0;
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&__range2);
  }
  std::__cxx11::string::~string((string *)&pos);
  return;
}

Assistant:

void Generator::remove_child_generator(const std::shared_ptr<Generator> &child) {
    auto child_name = child->instance_name;
    auto pos = std::find(children_names_.begin(), children_names_.end(), child_name);
    if (pos != children_names_.end()) {
        children_names_.erase(pos);
        children_.erase(child_name);
        children_comments_.erase(child_name);
        // need to remove every connected ports
        auto port_names = child->get_port_names();
        for (auto const &port_name : port_names) {
            auto port = child->get_port(port_name);
            if (port->port_direction() == PortDirection::In) {
                // do a copy
                auto srcs = std::unordered_set<std::shared_ptr<AssignStmt>>(port->sources().begin(),
                                                                            port->sources().end());
                for (auto const &stmt : srcs) {
                    auto *sink = stmt->right();
                    sink->unassign(stmt);
                    remove_stmt_from_parent(stmt);
                }
            } else {
                auto sinks = std::unordered_set<std::shared_ptr<AssignStmt>>(port->sinks().begin(),
                                                                             port->sinks().end());
                for (auto const &stmt : sinks) {
                    port->unassign(stmt);
                    remove_stmt_from_parent(stmt);
                }
            }
        }
        // set parent to null
        child->parent_generator_ = nullptr;
    }
}